

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

Type * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::GetMapValueType
          (Node *this,Type *found_type,TypeInfo *typeinfo)

{
  Type *pTVar1;
  LogMessage *pLVar2;
  Type **ppTVar3;
  Type *pTVar4;
  int index;
  StringPiece local_b8;
  LogMessage local_a8;
  undefined1 local_70 [8];
  StatusOr<const_google::protobuf::Type_*> sub_type;
  LogFinisher local_31;
  
  index = 0;
  sub_type.value_ = (Type *)typeinfo;
  do {
    if ((found_type->fields_).super_RepeatedPtrFieldBase.current_size_ <= index) {
      return (Type *)0x0;
    }
    pTVar1 = protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::Field>::TypeHandler>
                       (&(found_type->fields_).super_RepeatedPtrFieldBase,index);
    index = index + 1;
  } while (pTVar1->number_ != 2);
  if (pTVar1->kind_ == 0xb) {
    StringPiece::StringPiece<std::allocator<char>>(&local_b8,(pTVar1->type_url_).ptr_);
    (*((sub_type.value_)->super_Message).super_MessageLite._vptr_MessageLite[2])
              (local_70,sub_type.value_,local_b8.ptr_,local_b8.length_);
    if (local_70._0_4_ == OK) {
      ppTVar3 = StatusOr<const_google::protobuf::Type_*>::value
                          ((StatusOr<const_google::protobuf::Type_*> *)local_70);
      pTVar4 = *ppTVar3;
    }
    else {
      protobuf::internal::LogMessage::LogMessage
                (&local_a8,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/internal/default_value_objectwriter.cc"
                 ,0x123);
      pLVar2 = protobuf::internal::LogMessage::operator<<(&local_a8,"Cannot resolve type \'");
      pLVar2 = protobuf::internal::LogMessage::operator<<(pLVar2,(pTVar1->type_url_).ptr_);
      pLVar2 = protobuf::internal::LogMessage::operator<<(pLVar2,"\'.");
      protobuf::internal::LogFinisher::operator=(&local_31,pLVar2);
      protobuf::internal::LogMessage::~LogMessage(&local_a8);
      pTVar4 = (Type *)0x0;
    }
    std::__cxx11::string::~string((string *)&sub_type);
  }
  else {
    pTVar4 = (Type *)0x0;
  }
  return pTVar4;
}

Assistant:

const google::protobuf::Type* DefaultValueObjectWriter::Node::GetMapValueType(
    const google::protobuf::Type& found_type, const TypeInfo* typeinfo) {
  // If this field is a map, we should use the type of its "Value" as
  // the type of the child node.
  for (int i = 0; i < found_type.fields_size(); ++i) {
    const google::protobuf::Field& sub_field = found_type.fields(i);
    if (sub_field.number() != 2) {
      continue;
    }
    if (sub_field.kind() != google::protobuf::Field::TYPE_MESSAGE) {
      // This map's value type is not a message type. We don't need to
      // get the field_type in this case.
      break;
    }
    util::StatusOr<const google::protobuf::Type*> sub_type =
        typeinfo->ResolveTypeUrl(sub_field.type_url());
    if (!sub_type.ok()) {
      GOOGLE_LOG(WARNING) << "Cannot resolve type '" << sub_field.type_url() << "'.";
    } else {
      return sub_type.value();
    }
    break;
  }
  return nullptr;
}